

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
::occluded(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float fVar13;
  Collider CVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  AABBNodeMB4D *node1;
  Scene *pSVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  undefined4 uVar29;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Scene *pSVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  float fVar44;
  undefined1 auVar41 [16];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar60;
  float fVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  float fVar63;
  float fVar67;
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  float fVar70;
  uint uVar71;
  float fVar72;
  uint uVar73;
  float fVar74;
  uint uVar75;
  float fVar76;
  uint uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  uint uVar87;
  float fVar88;
  float fVar89;
  uint uVar90;
  float fVar91;
  float fVar92;
  uint uVar93;
  float fVar94;
  uint uVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  int local_9dc;
  byte *local_9d8;
  ulong local_9d0;
  ulong local_9c8;
  ulong local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  RayQueryContext *local_9a0;
  Ray *local_998;
  long local_990;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  float local_808 [4];
  float local_7f8 [4];
  float local_7e8 [4];
  NodeRef stack [244];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if ((*(long *)(*(long *)this + 0x70) != 8) &&
     (fVar13 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar13)) {
    local_9a0 = (RayQueryContext *)(stack + 1);
    stack[0].ptr = *(size_t *)(*(long *)this + 0x70);
    fVar21 = *(float *)&This->ptr;
    fVar22 = *(float *)((long)&This->ptr + 4);
    fVar23 = *(float *)&This->leafIntersector;
    CVar14 = This->collider;
    fVar85 = *(float *)((long)&This->leafIntersector + 4);
    fVar78 = 0.0;
    if (0.0 <= fVar85) {
      fVar78 = fVar85;
    }
    auVar40._4_4_ = -(uint)(ABS(CVar14.collide._4_4_) < DAT_01ff1d40._4_4_);
    auVar40._0_4_ = -(uint)(ABS(CVar14.collide._0_4_) < (float)DAT_01ff1d40);
    auVar40._8_4_ = -(uint)(ABS(CVar14.name._0_4_) < DAT_01ff1d40._8_4_);
    auVar40._12_4_ = -(uint)(ABS(CVar14.name._4_4_) < DAT_01ff1d40._12_4_);
    auVar55 = blendvps((undefined1  [16])CVar14,_DAT_01ff1d40,auVar40);
    auVar40 = rcpps(auVar40,auVar55);
    fVar85 = auVar40._0_4_;
    fVar88 = auVar40._4_4_;
    fVar91 = auVar40._8_4_;
    fVar85 = (1.0 - auVar55._0_4_ * fVar85) * fVar85 + fVar85;
    fVar88 = (1.0 - auVar55._4_4_ * fVar88) * fVar88 + fVar88;
    fVar91 = (1.0 - auVar55._8_4_ * fVar91) * fVar91 + fVar91;
    local_9a8 = (ulong)(fVar85 < 0.0) << 4;
    local_9b0 = (ulong)(fVar88 < 0.0) << 4 | 0x20;
    local_9b8 = (ulong)(fVar91 < 0.0) << 4 | 0x40;
    uVar35 = local_9a8 ^ 0x10;
    uVar37 = local_9b0 ^ 0x10;
    uVar30 = local_9b8 ^ 0x10;
    local_9c8 = uVar35;
    local_9d0 = uVar37;
    local_998 = ray;
    do {
      pSVar25 = (Scene *)stack;
      if ((Scene *)local_9a0 == pSVar25) {
        return;
      }
      pSVar33 = (Scene *)local_9a0[-1].args;
      local_9a0 = (RayQueryContext *)&local_9a0[-1].args;
      do {
        if (((ulong)pSVar33 & 8) == 0) {
          fVar46 = *(float *)((long)&(This->collider).name + 4);
          pSVar25 = (Scene *)((ulong)pSVar33 & 0xfffffffffffffff0);
          pfVar5 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + local_9a8);
          pfVar1 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + local_9a8);
          auVar56._0_4_ = ((*pfVar5 * fVar46 + *pfVar1) - fVar21) * fVar85;
          auVar56._4_4_ = ((pfVar5[1] * fVar46 + pfVar1[1]) - fVar21) * fVar85;
          auVar56._8_4_ = ((pfVar5[2] * fVar46 + pfVar1[2]) - fVar21) * fVar85;
          auVar56._12_4_ = ((pfVar5[3] * fVar46 + pfVar1[3]) - fVar21) * fVar85;
          auVar59._4_4_ = fVar78;
          auVar59._0_4_ = fVar78;
          auVar59._8_4_ = fVar78;
          auVar59._12_4_ = fVar78;
          pfVar5 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + local_9b0);
          pfVar1 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + local_9b0);
          auVar40 = maxps(auVar59,auVar56);
          auVar64._0_4_ = ((*pfVar5 * fVar46 + *pfVar1) - fVar22) * fVar88;
          auVar64._4_4_ = ((pfVar5[1] * fVar46 + pfVar1[1]) - fVar22) * fVar88;
          auVar64._8_4_ = ((pfVar5[2] * fVar46 + pfVar1[2]) - fVar22) * fVar88;
          auVar64._12_4_ = ((pfVar5[3] * fVar46 + pfVar1[3]) - fVar22) * fVar88;
          pfVar5 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + local_9b8);
          pfVar1 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + local_9b8);
          auVar57._0_4_ = ((*pfVar5 * fVar46 + *pfVar1) - fVar23) * fVar91;
          auVar57._4_4_ = ((pfVar5[1] * fVar46 + pfVar1[1]) - fVar23) * fVar91;
          auVar57._8_4_ = ((pfVar5[2] * fVar46 + pfVar1[2]) - fVar23) * fVar91;
          auVar57._12_4_ = ((pfVar5[3] * fVar46 + pfVar1[3]) - fVar23) * fVar91;
          auVar55 = maxps(auVar64,auVar57);
          auVar40 = maxps(auVar40,auVar55);
          pfVar5 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + uVar35);
          pfVar1 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + uVar35);
          auVar65._0_4_ = ((*pfVar5 * fVar46 + *pfVar1) - fVar21) * fVar85;
          auVar65._4_4_ = ((pfVar5[1] * fVar46 + pfVar1[1]) - fVar21) * fVar85;
          auVar65._8_4_ = ((pfVar5[2] * fVar46 + pfVar1[2]) - fVar21) * fVar85;
          auVar65._12_4_ = ((pfVar5[3] * fVar46 + pfVar1[3]) - fVar21) * fVar85;
          auVar58._4_4_ = fVar13;
          auVar58._0_4_ = fVar13;
          auVar58._8_4_ = fVar13;
          auVar58._12_4_ = fVar13;
          auVar59 = minps(auVar58,auVar65);
          pfVar2 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + uVar37);
          pfVar1 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + uVar37);
          pfVar3 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x78))->user + uVar30);
          pfVar5 = (float *)((long)&((RayQueryContext *)((long)pSVar25 + 0x18))->user + uVar30);
          auVar66._0_4_ = ((*pfVar2 * fVar46 + *pfVar1) - fVar22) * fVar88;
          auVar66._4_4_ = ((pfVar2[1] * fVar46 + pfVar1[1]) - fVar22) * fVar88;
          auVar66._8_4_ = ((pfVar2[2] * fVar46 + pfVar1[2]) - fVar22) * fVar88;
          auVar66._12_4_ = ((pfVar2[3] * fVar46 + pfVar1[3]) - fVar22) * fVar88;
          auVar55._4_4_ = ((pfVar3[1] * fVar46 + pfVar5[1]) - fVar23) * fVar91;
          auVar55._0_4_ = ((*pfVar3 * fVar46 + *pfVar5) - fVar23) * fVar91;
          auVar55._8_4_ = ((pfVar3[2] * fVar46 + pfVar5[2]) - fVar23) * fVar91;
          auVar55._12_4_ = ((pfVar3[3] * fVar46 + pfVar5[3]) - fVar23) * fVar91;
          auVar55 = minps(auVar66,auVar55);
          auVar55 = minps(auVar59,auVar55);
          uVar27 = (uint)pSVar33 & 7;
          context = (RayQueryContext *)(ulong)uVar27;
          bVar38 = auVar40._0_4_ <= auVar55._0_4_;
          bVar16 = auVar40._4_4_ <= auVar55._4_4_;
          bVar17 = auVar40._8_4_ <= auVar55._8_4_;
          bVar18 = auVar40._12_4_ <= auVar55._12_4_;
          if (uVar27 == 6) {
            bVar38 = (fVar46 < *(float *)&((RayQueryContext *)((long)pSVar25 + 0xf0))->scene &&
                     *(float *)&((RayQueryContext *)((long)pSVar25 + 0xd8))->user <= fVar46) &&
                     bVar38;
            bVar16 = (fVar46 < *(float *)((long)&((RayQueryContext *)((long)pSVar25 + 0xf0))->scene
                                         + 4) &&
                     *(float *)((long)&((RayQueryContext *)((long)pSVar25 + 0xd8))->user + 4) <=
                     fVar46) && bVar16;
            bVar17 = (fVar46 < *(float *)&((RayQueryContext *)((long)pSVar25 + 0xf0))->user &&
                     *(float *)&((RayQueryContext *)((long)pSVar25 + 0xd8))->args <= fVar46) &&
                     bVar17;
            bVar18 = (fVar46 < *(float *)((long)&((RayQueryContext *)((long)pSVar25 + 0xf0))->user +
                                         4) &&
                     *(float *)((long)&((RayQueryContext *)((long)pSVar25 + 0xd8))->args + 4) <=
                     fVar46) && bVar18;
          }
          auVar47._0_4_ = (uint)bVar38 * -0x80000000;
          auVar47._4_4_ = (uint)bVar16 * -0x80000000;
          auVar47._8_4_ = (uint)bVar17 * -0x80000000;
          auVar47._12_4_ = (uint)bVar18 * -0x80000000;
          uVar29 = movmskps((int)unaff_RBX,auVar47);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar29);
        }
        if (((ulong)pSVar33 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar34 = 4;
          }
          else {
            uVar32 = (ulong)pSVar33 & 0xfffffffffffffff0;
            lVar36 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
              }
            }
            iVar34 = 0;
            pSVar25 = *(Scene **)(uVar32 + lVar36 * 8);
            uVar31 = unaff_RBX - 1 & unaff_RBX;
            pSVar33 = pSVar25;
            if (uVar31 != 0) {
              local_9a0->scene = pSVar25;
              lVar36 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                }
              }
              uVar26 = uVar31 - 1;
              while( true ) {
                local_9a0 = (RayQueryContext *)&local_9a0->user;
                context = *(RayQueryContext **)(uVar32 + lVar36 * 8);
                uVar26 = uVar26 & uVar31;
                if (uVar26 == 0) break;
                *(RayQueryContext **)local_9a0 = context;
                lVar36 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                uVar31 = uVar26 - 1;
              }
              pSVar25 = (Scene *)0x0;
              pSVar33 = (Scene *)context;
            }
          }
        }
        else {
          iVar34 = 6;
        }
      } while (iVar34 == 0);
      if (iVar34 == 6) {
        iVar34 = 0;
        local_9c0 = (ulong)((uint)pSVar33 & 0xf) - 8;
        bVar38 = local_9c0 != 0;
        if (bVar38) {
          uVar32 = (ulong)pSVar33 & 0xfffffffffffffff0;
          uVar31 = 0;
          do {
            lVar36 = uVar31 * 0x140;
            fVar46 = *(float *)((long)&(This->collider).name + 4);
            pfVar5 = (float *)(uVar32 + 0x90 + lVar36);
            pfVar1 = (float *)(uVar32 + lVar36);
            fVar63 = *pfVar5 * fVar46 + *pfVar1;
            fVar67 = pfVar5[1] * fVar46 + pfVar1[1];
            fVar68 = pfVar5[2] * fVar46 + pfVar1[2];
            fVar69 = pfVar5[3] * fVar46 + pfVar1[3];
            pfVar5 = (float *)(uVar32 + 0xa0 + lVar36);
            pfVar1 = (float *)(uVar32 + 0x10 + lVar36);
            fVar54 = *pfVar5 * fVar46 + *pfVar1;
            fVar60 = pfVar5[1] * fVar46 + pfVar1[1];
            fVar61 = pfVar5[2] * fVar46 + pfVar1[2];
            fVar62 = pfVar5[3] * fVar46 + pfVar1[3];
            pfVar5 = (float *)(uVar32 + 0xb0 + lVar36);
            pfVar1 = (float *)(uVar32 + 0x20 + lVar36);
            fVar39 = *pfVar5 * fVar46 + *pfVar1;
            fVar42 = pfVar5[1] * fVar46 + pfVar1[1];
            fVar43 = pfVar5[2] * fVar46 + pfVar1[2];
            fVar44 = pfVar5[3] * fVar46 + pfVar1[3];
            pfVar6 = (float *)(uVar32 + 0xc0 + lVar36);
            pfVar1 = (float *)(uVar32 + 0x30 + lVar36);
            pfVar7 = (float *)(uVar32 + 0xd0 + lVar36);
            pfVar5 = (float *)(uVar32 + 0x40 + lVar36);
            pfVar8 = (float *)(uVar32 + 0xe0 + lVar36);
            pfVar2 = (float *)(uVar32 + 0x50 + lVar36);
            pfVar9 = (float *)(uVar32 + 0xf0 + lVar36);
            pfVar3 = (float *)(uVar32 + 0x60 + lVar36);
            pfVar10 = (float *)(uVar32 + 0x100 + lVar36);
            pfVar4 = (float *)(uVar32 + 0x70 + lVar36);
            pfVar11 = (float *)(uVar32 + 0x110 + lVar36);
            pfVar12 = (float *)(uVar32 + 0x80 + lVar36);
            fVar86 = fVar63 - (*pfVar6 * fVar46 + *pfVar1);
            fVar89 = fVar67 - (pfVar6[1] * fVar46 + pfVar1[1]);
            fVar92 = fVar68 - (pfVar6[2] * fVar46 + pfVar1[2]);
            fVar94 = fVar69 - (pfVar6[3] * fVar46 + pfVar1[3]);
            fVar100 = fVar54 - (*pfVar7 * fVar46 + *pfVar5);
            fVar101 = fVar60 - (pfVar7[1] * fVar46 + pfVar5[1]);
            fVar102 = fVar61 - (pfVar7[2] * fVar46 + pfVar5[2]);
            fVar103 = fVar62 - (pfVar7[3] * fVar46 + pfVar5[3]);
            fVar104 = fVar39 - (*pfVar8 * fVar46 + *pfVar2);
            fVar106 = fVar42 - (pfVar8[1] * fVar46 + pfVar2[1]);
            fVar108 = fVar43 - (pfVar8[2] * fVar46 + pfVar2[2]);
            fVar110 = fVar44 - (pfVar8[3] * fVar46 + pfVar2[3]);
            fVar45 = (*pfVar9 * fVar46 + *pfVar3) - fVar63;
            fVar48 = (pfVar9[1] * fVar46 + pfVar3[1]) - fVar67;
            fVar50 = (pfVar9[2] * fVar46 + pfVar3[2]) - fVar68;
            fVar52 = (pfVar9[3] * fVar46 + pfVar3[3]) - fVar69;
            fVar79 = (*pfVar10 * fVar46 + *pfVar4) - fVar54;
            fVar81 = (pfVar10[1] * fVar46 + pfVar4[1]) - fVar60;
            fVar83 = (pfVar10[2] * fVar46 + pfVar4[2]) - fVar61;
            fVar84 = (pfVar10[3] * fVar46 + pfVar4[3]) - fVar62;
            fVar70 = (fVar46 * *pfVar11 + *pfVar12) - fVar39;
            fVar72 = (fVar46 * pfVar11[1] + pfVar12[1]) - fVar42;
            fVar74 = (fVar46 * pfVar11[2] + pfVar12[2]) - fVar43;
            fVar76 = (fVar46 * pfVar11[3] + pfVar12[3]) - fVar44;
            local_808[0] = fVar104 * fVar79 - fVar100 * fVar70;
            local_808[1] = fVar106 * fVar81 - fVar101 * fVar72;
            local_808[2] = fVar108 * fVar83 - fVar102 * fVar74;
            local_808[3] = fVar110 * fVar84 - fVar103 * fVar76;
            fVar46 = *(float *)&This->ptr;
            fVar49 = *(float *)((long)&This->ptr + 4);
            fVar51 = *(float *)&This->leafIntersector;
            fVar53 = *(float *)&(This->collider).collide;
            fVar80 = *(float *)((long)&(This->collider).collide + 4);
            fVar82 = *(float *)&(This->collider).name;
            fVar63 = fVar63 - fVar46;
            fVar67 = fVar67 - fVar46;
            fVar68 = fVar68 - fVar46;
            fVar69 = fVar69 - fVar46;
            fVar54 = fVar54 - fVar49;
            fVar60 = fVar60 - fVar49;
            fVar61 = fVar61 - fVar49;
            fVar62 = fVar62 - fVar49;
            fVar116 = fVar63 * fVar80 - fVar54 * fVar53;
            fVar117 = fVar67 * fVar80 - fVar60 * fVar53;
            fVar118 = fVar68 * fVar80 - fVar61 * fVar53;
            fVar119 = fVar69 * fVar80 - fVar62 * fVar53;
            local_7f8[0] = fVar86 * fVar70 - fVar104 * fVar45;
            local_7f8[1] = fVar89 * fVar72 - fVar106 * fVar48;
            local_7f8[2] = fVar92 * fVar74 - fVar108 * fVar50;
            local_7f8[3] = fVar94 * fVar76 - fVar110 * fVar52;
            fVar39 = fVar39 - fVar51;
            fVar42 = fVar42 - fVar51;
            fVar43 = fVar43 - fVar51;
            fVar44 = fVar44 - fVar51;
            fVar112 = fVar39 * fVar53 - fVar63 * fVar82;
            fVar113 = fVar42 * fVar53 - fVar67 * fVar82;
            fVar114 = fVar43 * fVar53 - fVar68 * fVar82;
            fVar115 = fVar44 * fVar53 - fVar69 * fVar82;
            local_7e8[0] = fVar100 * fVar45 - fVar86 * fVar79;
            local_7e8[1] = fVar101 * fVar48 - fVar89 * fVar81;
            local_7e8[2] = fVar102 * fVar50 - fVar92 * fVar83;
            local_7e8[3] = fVar103 * fVar52 - fVar94 * fVar84;
            fVar105 = fVar54 * fVar82 - fVar39 * fVar80;
            fVar107 = fVar60 * fVar82 - fVar42 * fVar80;
            fVar109 = fVar61 * fVar82 - fVar43 * fVar80;
            fVar111 = fVar62 * fVar82 - fVar44 * fVar80;
            fVar96 = fVar53 * local_808[0] + fVar80 * local_7f8[0] + fVar82 * local_7e8[0];
            fVar97 = fVar53 * local_808[1] + fVar80 * local_7f8[1] + fVar82 * local_7e8[1];
            fVar98 = fVar53 * local_808[2] + fVar80 * local_7f8[2] + fVar82 * local_7e8[2];
            fVar99 = fVar53 * local_808[3] + fVar80 * local_7f8[3] + fVar82 * local_7e8[3];
            uVar71 = (uint)fVar96 & 0x80000000;
            uVar73 = (uint)fVar97 & 0x80000000;
            uVar75 = (uint)fVar98 & 0x80000000;
            uVar77 = (uint)fVar99 & 0x80000000;
            fVar46 = (float)((uint)(fVar45 * fVar105 + fVar79 * fVar112 + fVar70 * fVar116) ^ uVar71
                            );
            fVar49 = (float)((uint)(fVar48 * fVar107 + fVar81 * fVar113 + fVar72 * fVar117) ^ uVar73
                            );
            fVar51 = (float)((uint)(fVar50 * fVar109 + fVar83 * fVar114 + fVar74 * fVar118) ^ uVar75
                            );
            fVar53 = (float)((uint)(fVar52 * fVar111 + fVar84 * fVar115 + fVar76 * fVar119) ^ uVar77
                            );
            fVar50 = (float)((uint)(fVar105 * fVar86 + fVar112 * fVar100 + fVar116 * fVar104) ^
                            uVar71);
            fVar52 = (float)((uint)(fVar107 * fVar89 + fVar113 * fVar101 + fVar117 * fVar106) ^
                            uVar73);
            fVar70 = (float)((uint)(fVar109 * fVar92 + fVar114 * fVar102 + fVar118 * fVar108) ^
                            uVar75);
            fVar72 = (float)((uint)(fVar111 * fVar94 + fVar115 * fVar103 + fVar119 * fVar110) ^
                            uVar77);
            fVar80 = ABS(fVar96);
            fVar82 = ABS(fVar97);
            fVar45 = ABS(fVar98);
            fVar48 = ABS(fVar99);
            local_8a8 = auVar24._0_4_;
            uStack_8a4 = auVar24._4_4_;
            uStack_8a0 = auVar24._8_4_;
            uStack_89c = auVar24._12_4_;
            uVar87 = -(uint)(fVar46 + fVar50 <= fVar80) &
                     -(uint)((0.0 <= fVar50 && 0.0 <= fVar46) && fVar96 != 0.0) & local_8a8;
            uVar90 = -(uint)(fVar49 + fVar52 <= fVar82) &
                     -(uint)((0.0 <= fVar52 && 0.0 <= fVar49) && fVar97 != 0.0) & uStack_8a4;
            uVar93 = -(uint)(fVar51 + fVar70 <= fVar45) &
                     -(uint)((0.0 <= fVar70 && 0.0 <= fVar51) && fVar98 != 0.0) & uStack_8a0;
            uVar95 = -(uint)(fVar53 + fVar72 <= fVar48) &
                     -(uint)((0.0 <= fVar72 && 0.0 <= fVar53) && fVar99 != 0.0) & uStack_89c;
            auVar20._4_4_ = uVar90;
            auVar20._0_4_ = uVar87;
            auVar20._8_4_ = uVar93;
            auVar20._12_4_ = uVar95;
            uVar27 = movmskps((int)pSVar25,auVar20);
            pSVar25 = (Scene *)(ulong)uVar27;
            if (uVar27 != 0) {
              fVar54 = (float)(uVar71 ^ (uint)(fVar63 * local_808[0] +
                                              fVar54 * local_7f8[0] + fVar39 * local_7e8[0]));
              fVar60 = (float)(uVar73 ^ (uint)(fVar67 * local_808[1] +
                                              fVar60 * local_7f8[1] + fVar42 * local_7e8[1]));
              fVar43 = (float)(uVar75 ^ (uint)(fVar68 * local_808[2] +
                                              fVar61 * local_7f8[2] + fVar43 * local_7e8[2]));
              fVar44 = (float)(uVar77 ^ (uint)(fVar69 * local_808[3] +
                                              fVar62 * local_7f8[3] + fVar44 * local_7e8[3]));
              fVar39 = *(float *)((long)&This->leafIntersector + 4);
              fVar42 = *(float *)&(This->intersector1).intersect;
              auVar41._0_4_ =
                   -(uint)(fVar54 <= fVar42 * fVar80 && fVar39 * fVar80 < fVar54) & uVar87;
              auVar41._4_4_ =
                   -(uint)(fVar60 <= fVar42 * fVar82 && fVar39 * fVar82 < fVar60) & uVar90;
              auVar41._8_4_ =
                   -(uint)(fVar43 <= fVar42 * fVar45 && fVar39 * fVar45 < fVar43) & uVar93;
              auVar41._12_4_ =
                   -(uint)(fVar44 <= fVar42 * fVar48 && fVar39 * fVar48 < fVar44) & uVar95;
              iVar28 = movmskps((int)context,auVar41);
              context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),iVar28);
              if (iVar28 != 0) {
                local_990 = *(long *)&(local_998->org).field_0;
                auVar19._4_4_ = fVar82;
                auVar19._0_4_ = fVar80;
                auVar19._8_4_ = fVar45;
                auVar19._12_4_ = fVar48;
                auVar40 = rcpps(auVar41,auVar19);
                fVar39 = auVar40._0_4_;
                fVar42 = auVar40._4_4_;
                fVar61 = auVar40._8_4_;
                fVar62 = auVar40._12_4_;
                fVar39 = (1.0 - fVar80 * fVar39) * fVar39 + fVar39;
                fVar42 = (1.0 - fVar82 * fVar42) * fVar42 + fVar42;
                fVar61 = (1.0 - fVar45 * fVar61) * fVar61 + fVar61;
                fVar62 = (1.0 - fVar48 * fVar62) * fVar62 + fVar62;
                local_818[0] = fVar54 * fVar39;
                local_818[1] = fVar60 * fVar42;
                local_818[2] = fVar43 * fVar61;
                local_818[3] = fVar44 * fVar62;
                local_838._0_4_ = fVar46 * fVar39;
                local_838._4_4_ = fVar49 * fVar42;
                local_838._8_4_ = fVar51 * fVar61;
                local_838._12_4_ = fVar53 * fVar62;
                local_828._0_4_ = fVar39 * fVar50;
                local_828._4_4_ = fVar42 * fVar52;
                local_828._8_4_ = fVar61 * fVar70;
                local_828._12_4_ = fVar62 * fVar72;
                do {
                  uVar35 = 0;
                  if ((RTCIntersectArguments *)context != (RTCIntersectArguments *)0x0) {
                    for (; ((ulong)context >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  h.geomID = *(uint *)(lVar36 + uVar32 + 0x120 + uVar35 * 4);
                  lVar15 = *(long *)(*(long *)(local_990 + 0x1e8) + (ulong)h.geomID * 8);
                  if ((*(uint *)(lVar15 + 0x34) &
                      *(uint *)((long)&(This->intersector1).intersect + 4)) == 0) {
                    context = (RayQueryContext *)((ulong)context ^ 1L << (uVar35 & 0x3f));
                    pSVar25 = (Scene *)CONCAT71((int7)(uVar35 >> 8),1);
                  }
                  else {
                    local_9d8 = *(byte **)&(local_998->dir).field_0;
                    if ((*(long *)(local_9d8 + 0x10) == 0) && (*(long *)(lVar15 + 0x48) == 0)) {
                      pSVar25 = (Scene *)0x0;
                    }
                    else {
                      args.context = *(RTCRayQueryContext **)((long)&(local_998->org).field_0 + 8);
                      h.Ng.field_0.field_0.x = local_808[uVar35];
                      h.Ng.field_0.field_0.y = local_7f8[uVar35];
                      h.Ng.field_0.field_0.z = local_7e8[uVar35];
                      h.u = *(float *)(local_838 + uVar35 * 4);
                      h.v = local_818[uVar35 - 4];
                      h.primID = *(uint *)(lVar36 + uVar32 + 0x130 + uVar35 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      uVar29 = *(undefined4 *)&(This->intersector1).intersect;
                      *(float *)&(This->intersector1).intersect = local_818[uVar35];
                      local_9dc = -1;
                      args.valid = &local_9dc;
                      args.geometryUserPtr = *(void **)(lVar15 + 0x18);
                      args.ray = (RTCRayN *)This;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      if ((*(code **)(lVar15 + 0x48) == (code *)0x0) ||
                         ((**(code **)(lVar15 + 0x48))(&args), *args.valid != 0)) {
                        if (*(code **)(local_9d8 + 0x10) != (code *)0x0) {
                          if (((*local_9d8 & 2) != 0) || ((*(byte *)(lVar15 + 0x3e) & 0x40) != 0)) {
                            (**(code **)(local_9d8 + 0x10))(&args);
                          }
                          if (*args.valid == 0) goto LAB_002251c3;
                        }
                        pSVar25 = (Scene *)0x0;
                      }
                      else {
LAB_002251c3:
                        *(undefined4 *)&(This->intersector1).intersect = uVar29;
                        context = (RayQueryContext *)((ulong)context ^ 1L << (uVar35 & 0x3f));
                        pSVar25 = (Scene *)CONCAT71((int7)((ulong)context >> 8),1);
                      }
                    }
                  }
                  if ((char)pSVar25 == '\0') {
                    uVar35 = local_9c8;
                    uVar37 = local_9d0;
                    if (bVar38) {
                      *(undefined4 *)&(This->intersector1).intersect = 0xff800000;
                      iVar34 = 3;
                    }
                    goto LAB_0022526c;
                  }
                } while ((RTCIntersectArguments *)context != (RTCIntersectArguments *)0x0);
              }
            }
            uVar31 = uVar31 + 1;
            bVar38 = uVar31 < local_9c0;
            uVar35 = local_9c8;
            uVar37 = local_9d0;
          } while (uVar31 != local_9c0);
        }
      }
LAB_0022526c:
    } while (iVar34 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }